

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

char * ssh2_fingerprint_blob(ptrlen blob,FingerprintType fptype)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  strbuf *buf;
  ssh_keyalg *psVar4;
  char *pcVar5;
  long lVar6;
  uint i;
  ulong uVar7;
  ptrlen pVar8;
  char local_7d [5];
  uchar digest [32];
  BinarySource src [1];
  
  buf = strbuf_new();
  src[0].binarysource_ = src;
  src[0].pos = 0;
  src[0].err = BSE_NO_ERROR;
  src[0].data = blob.ptr;
  src[0].len = blob.len;
  pVar8 = BinarySource_get_string(src[0].binarysource_);
  if ((src[0].binarysource_)->err == BSE_NO_ERROR) {
    psVar4 = find_pubkey_alg_len(pVar8);
    if (psVar4 == (ssh_keyalg *)0x0) {
      uVar2 = string_length_for_printf(pVar8.len);
      BinarySink_put_fmt(buf->binarysink_,"%.*s ",(ulong)uVar2,pVar8.ptr);
    }
    else {
      uVar2 = (*psVar4->pubkey_bits)(psVar4,blob);
      uVar3 = string_length_for_printf(pVar8.len);
      BinarySink_put_fmt(buf->binarysink_,"%.*s %d ",(ulong)uVar3,pVar8.ptr,(ulong)uVar2);
    }
  }
  if (fptype == SSH_FPTYPE_SHA256) {
    hash_simple(&ssh_sha256,blob,digest);
    pVar8.len = 7;
    pVar8.ptr = "SHA256:";
    BinarySink_put_datapl(buf->binarysink_,pVar8);
    uVar2 = 0x20;
    for (uVar7 = 0; uVar7 < 0x20; uVar7 = uVar7 + 3) {
      uVar3 = 3;
      if (uVar2 < 3) {
        uVar3 = uVar2;
      }
      base64_encode_atom(digest + uVar7,uVar3,local_7d);
      BinarySink_put_data(buf->binarysink_,local_7d,4);
      uVar2 = uVar2 - 3;
    }
    strbuf_chomp(buf,'=');
  }
  else if (fptype == SSH_FPTYPE_MD5) {
    hash_simple(&ssh_md5,blob,digest);
    lVar6 = -0x10;
    while (lVar6 != 0) {
      lVar1 = lVar6 + 0x10;
      lVar6 = lVar6 + 1;
      pcVar5 = ":";
      if (lVar6 == 0) {
        pcVar5 = anon_var_dwarf_3291b + 10;
      }
      BinarySink_put_fmt(buf->binarysink_,"%02x%s",(ulong)digest[lVar1],pcVar5);
    }
  }
  pcVar5 = strbuf_to_str(buf);
  return pcVar5;
}

Assistant:

char *ssh2_fingerprint_blob(ptrlen blob, FingerprintType fptype)
{
    strbuf *sb = strbuf_new();

    /*
     * Identify the key algorithm, if possible.
     *
     * If we can't do that, then we have a seriously confused key
     * blob, in which case we return only the hash.
     */
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);
    ptrlen algname = get_string(src);
    if (!get_err(src)) {
        const ssh_keyalg *alg = find_pubkey_alg_len(algname);
        if (alg) {
            int bits = ssh_key_public_bits(alg, blob);
            put_fmt(sb, "%.*s %d ", PTRLEN_PRINTF(algname), bits);
        } else {
            put_fmt(sb, "%.*s ", PTRLEN_PRINTF(algname));
        }
    }

    switch (fptype) {
      case SSH_FPTYPE_MD5:
        ssh2_fingerprint_blob_md5(blob, sb);
        break;
      case SSH_FPTYPE_SHA256:
        ssh2_fingerprint_blob_sha256(blob, sb);
        break;
    }

    return strbuf_to_str(sb);
}